

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::EmptyCharsetFuzz(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_290;
  StringPiece local_100;
  RE2 local_f0;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    RE2::RE2(&local_f0,EmptyCharsetFuzz::empties[local_c]);
    StringPiece::StringPiece(&local_100,"abc");
    bVar1 = RE2::Match(&local_f0,&local_100,0,3,UNANCHORED,(StringPiece *)0x0,0);
    RE2::~RE2(&local_f0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x1fd);
      poVar2 = LogMessage::stream(&local_290);
      std::operator<<(poVar2,
                      "Check failed: !RE2(empties[i]).Match(\"abc\", 0, 3, RE2::UNANCHORED, NULL, 0)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
    }
  }
  return;
}

Assistant:

TEST(EmptyCharset, Fuzz) {
  static const char *empties[] = {
    "[^\\S\\s]",
    "[^\\S[:space:]]",
    "[^\\D\\d]",
    "[^\\D[:digit:]]"
  };
  for (int i = 0; i < arraysize(empties); i++)
    CHECK(!RE2(empties[i]).Match("abc", 0, 3, RE2::UNANCHORED, NULL, 0));
}